

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensor.cpp
# Opt level: O3

Knowledge __thiscall components::Sensor::percept_to_knowledge(Sensor *this,Percepts perceptions)

{
  uint uVar1;
  undefined2 in_register_00000036;
  undefined1 auVar2 [16];
  Knowledge KVar3;
  
  uVar1 = perceptions._0_4_;
  auVar2._4_4_ = (uint)(CONCAT26(in_register_00000036,perceptions) >> 0x20);
  auVar2._0_4_ = uVar1;
  auVar2._8_4_ = uVar1;
  auVar2._12_4_ = auVar2._4_4_;
  KVar3._0_8_ = SUB168(auVar2 & _DAT_001091d0,8) | SUB168(auVar2 & _DAT_001091d0,0) |
                (ulong)(uVar1 & 1) | (ulong)(auVar2._4_4_ >> 8 & 1) << 0x30;
  KVar3.pit = false;
  KVar3.gold = false;
  KVar3.ok = false;
  KVar3.visited = false;
  return KVar3;
}

Assistant:

Knowledge Sensor::percept_to_knowledge(Percepts perceptions)
    {
        Knowledge kb;
        kb.stench = perceptions.stench;
        kb.breeze = perceptions.breeze;
        kb.glitter = perceptions.glitter;
        kb.bump = perceptions.bump;
        kb.scream = perceptions.scream;
        kb.wumpus = perceptions.wumpus;
        return kb;
    }